

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O0

BinaryPacketProtocol * ssh1_bpp_new(LogContext *logctx)

{
  void *__s;
  ssh1_bpp_state *s;
  LogContext *logctx_local;
  
  __s = safemalloc(1,0x168,0);
  memset(__s,0,0x168);
  *(BinaryPacketProtocolVtable **)((long)__s + 0x88) = &ssh1_bpp_vtable;
  *(LogContext **)((long)__s + 0x120) = logctx;
  ssh_bpp_common_setup((BinaryPacketProtocol *)((long)__s + 0x88));
  return (BinaryPacketProtocol *)((long)__s + 0x88);
}

Assistant:

BinaryPacketProtocol *ssh1_bpp_new(LogContext *logctx)
{
    struct ssh1_bpp_state *s = snew(struct ssh1_bpp_state);
    memset(s, 0, sizeof(*s));
    s->bpp.vt = &ssh1_bpp_vtable;
    s->bpp.logctx = logctx;
    ssh_bpp_common_setup(&s->bpp);
    return &s->bpp;
}